

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minipointcounter_test.cpp
# Opt level: O0

void __thiscall
TEST_GROUP_CppUTestGroupMinipointCounterTest::~TEST_GROUP_CppUTestGroupMinipointCounterTest
          (TEST_GROUP_CppUTestGroupMinipointCounterTest *this)

{
  TEST_GROUP_CppUTestGroupMinipointCounterTest *mem;
  TEST_GROUP_CppUTestGroupMinipointCounterTest *this_local;
  
  mem = this;
  ~TEST_GROUP_CppUTestGroupMinipointCounterTest(this);
  operator_delete(mem,(size_t)this);
  return;
}

Assistant:

TEST_GROUP(MinipointCounterTest)
{
	WiningState s;
	WiningHand h;
	MinipointCounter m { h, s };

	void addPair(Tile tile)
	{
		h.pairs.push_back(vector<Tile>{ tile, tile });
		h.last_tile = tile;
	}

	void addTriplet(Tile tile, bool is_open)
	{
		h.melds.push_back({ { tile, tile, tile }, is_open });
		h.last_tile = tile;
	}

	void addQuad(Tile tile, bool is_open)
	{
		h.melds.push_back({ { tile, tile, tile, tile }, is_open });
		h.last_tile = tile;
	}

	void addSequence(Tile tile, bool is_open)
	{
		auto next = NextTile()(tile);
		auto last = NextTile()(next);

		vector<Tile> tiles {
			tile,
			next,
			last,
		};
		h.melds.push_back({ tiles, is_open });
		h.last_tile = last;
	}

	void addNoPointHand()
	{
		addPair(Tile::SouthWind);
		addSequence(Tile::OneOfCharacters, false);
		addSequence(Tile::TwoOfCircles, false);
		addSequence(Tile::TwoOfBamboos, false);
		addSequence(Tile::SevenOfCharacters, false);
	}

	void addOpenNoPointHand()
	{
		// Terminal or honor in each set
		addPair(Tile::SouthWind);
		addSequence(Tile::OneOfCharacters, false);
		addSequence(Tile::OneOfCircles, true);
		addSequence(Tile::OneOfBamboos, true);
		addSequence(Tile::SevenOfCharacters, false);
	}

	void addOpenNoPointsHandWithoutPair()
	{
		addSequence(Tile::TwoOfCharacters, false);
		addSequence(Tile::TwoOfCircles, true);
		addSequence(Tile::TwoOfBamboos, true);
		addSequence(Tile::SevenOfCharacters, false);
	}

	void addOpenNoPointsHandWithoutOneMeld()
	{
		addPair(Tile::SouthWind);
		addSequence(Tile::TwoOfCircles, true);
		addSequence(Tile::TwoOfBamboos, true);
		addSequence(Tile::TwoOfCharacters, false);
	}
}